

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall
pbrt::BinaryReader::read<pbrt::math::vec3i,std::allocator<pbrt::math::vec3i>,void>
          (BinaryReader *this,vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *vt)

{
  uint64_t length;
  size_type local_20;
  
  read<unsigned_long,void>(this,&local_20);
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::resize(vt,local_20);
  copyBytes<pbrt::math::vec3i>
            (this,(vt->super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>).
                  _M_impl.super__Vector_impl_data._M_start,local_20 * 0xc);
  return;
}

Assistant:

inline void read(std::vector<T, A> &vt)
    {
      uint64_t length;
      read(length);
      vt.resize(length);
      copyBytes(vt.data(), length*sizeof(T));
    }